

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_output_chain.c
# Opt level: O3

ngx_int_t ngx_chain_writer(void *data,ngx_chain_t *in)

{
  ushort uVar1;
  long lVar2;
  ngx_buf_t *pnVar3;
  long *plVar4;
  long *plVar5;
  ngx_log_t *pnVar6;
  long lVar7;
  ngx_chain_t *pnVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  
  lVar2 = *(long *)((long)data + 0x10);
  if (in == (ngx_chain_t *)0x0) {
    lVar12 = 0;
  }
  else {
    lVar12 = 0;
    do {
      pnVar3 = in->buf;
      uVar1 = *(ushort *)&pnVar3->field_0x48;
      if ((uVar1 & 7) == 0) {
        lVar7 = pnVar3->file_last - pnVar3->file_pos;
      }
      else {
        lVar7 = (long)pnVar3->last - (long)pnVar3->pos;
      }
      if ((lVar7 == 0) && ((uVar1 & 0xe0) == 0 || (uVar1 & 0x17) != 0)) {
        pnVar6 = *(ngx_log_t **)(*(long *)((long)data + 0x18) + 0x48);
        if (1 < pnVar6->log_level) {
          ngx_log_error_core(2,pnVar6,0,
                             "zero size buf in chain writer t:%d r:%d f:%d %p %p-%p %p %O-%O",
                             (ulong)(uVar1 & 1),(ulong)(uVar1 >> 3 & 1),(ulong)(uVar1 >> 4 & 1),
                             pnVar3->start,pnVar3->pos,pnVar3->last,pnVar3->file,pnVar3->file_pos,
                             pnVar3->file_last);
        }
        ngx_debug_point();
      }
      else {
        if ((uVar1 & 7) == 0) {
          lVar7 = pnVar3->file_last - pnVar3->file_pos;
        }
        else {
          lVar7 = (long)pnVar3->last - (long)pnVar3->pos;
        }
        if (((*(ngx_log_t **)(lVar2 + 0x50))->log_level & 0x10) != 0) {
          if ((uVar1 & 7) == 0) {
            lVar11 = pnVar3->file_last - pnVar3->file_pos;
          }
          else {
            lVar11 = (long)pnVar3->last - (long)pnVar3->pos;
          }
          ngx_log_error_core(8,*(ngx_log_t **)(lVar2 + 0x50),0,"chain writer buf fl:%d s:%uO",
                             (ulong)(uVar1 >> 5 & 1),lVar11);
        }
        pnVar8 = ngx_alloc_chain_link(*(ngx_pool_t **)((long)data + 0x18));
        if (pnVar8 == (ngx_chain_t *)0x0) {
          return -1;
        }
        lVar12 = lVar12 + lVar7;
        pnVar8->buf = in->buf;
        pnVar8->next = (ngx_chain_t *)0x0;
        **(undefined8 **)((long)data + 8) = pnVar8;
        *(ngx_chain_t ***)((long)data + 8) = &pnVar8->next;
      }
      in = in->next;
    } while (in != (ngx_chain_t *)0x0);
  }
  if (((*(ngx_log_t **)(lVar2 + 0x50))->log_level & 0x10) != 0) {
    ngx_log_error_core(8,*(ngx_log_t **)(lVar2 + 0x50),0,"chain writer in: %p",*data);
  }
  for (plVar4 = *data; plVar4 != (long *)0x0; plVar4 = (long *)plVar4[1]) {
    plVar5 = (long *)*plVar4;
    uVar1 = *(ushort *)(plVar5 + 9);
    if ((uVar1 & 7) == 0) {
      lVar7 = plVar5[3] - plVar5[2];
    }
    else {
      lVar7 = plVar5[1] - *plVar5;
    }
    if ((lVar7 == 0) && ((uVar1 & 0xe0) == 0 || (uVar1 & 0x17) != 0)) {
      pnVar6 = *(ngx_log_t **)(*(long *)((long)data + 0x18) + 0x48);
      if (1 < pnVar6->log_level) {
        ngx_log_error_core(2,pnVar6,0,
                           "zero size buf in chain writer t:%d r:%d f:%d %p %p-%p %p %O-%O",
                           (ulong)(uVar1 & 1),(ulong)(uVar1 >> 3 & 1),(ulong)(uVar1 >> 4 & 1),
                           plVar5[4],*plVar5,plVar5[1],plVar5[7],plVar5[2],plVar5[3]);
      }
      ngx_debug_point();
    }
    else {
      if ((uVar1 & 7) == 0) {
        lVar7 = plVar5[3] - plVar5[2];
      }
      else {
        lVar7 = plVar5[1] - *plVar5;
      }
      lVar12 = lVar12 + lVar7;
    }
  }
  if ((lVar12 != 0) || (*(char *)(lVar2 + 0xd8) != '\0')) {
    lVar12 = (**(code **)(lVar2 + 0x38))(lVar2,*data,*(undefined8 *)((long)data + 0x20));
    if (((*(ngx_log_t **)(lVar2 + 0x50))->log_level & 0x10) != 0) {
      ngx_log_error_core(8,*(ngx_log_t **)(lVar2 + 0x50),0,"chain writer out: %p",lVar12);
    }
    if (lVar12 == -1) {
      return -1;
    }
    lVar7 = *data;
    if ((lVar7 != 0) && (lVar7 != lVar12)) {
      lVar11 = *(long *)((long)data + 0x18);
      lVar10 = *(long *)(lVar11 + 0x30);
      do {
        lVar9 = lVar7;
        lVar7 = *(long *)(lVar9 + 8);
        *(long *)(lVar9 + 8) = lVar10;
        if (lVar7 == 0) break;
        lVar10 = lVar9;
      } while (lVar7 != lVar12);
      *(long *)(lVar11 + 0x30) = lVar9;
    }
    *(long *)data = lVar12;
    if ((lVar12 != 0) || (*(void **)((long)data + 8) = data, *(char *)(lVar2 + 0xd8) != '\0')) {
      return -2;
    }
  }
  return 0;
}

Assistant:

ngx_int_t
ngx_chain_writer(void *data, ngx_chain_t *in)
{
    ngx_chain_writer_ctx_t *ctx = data;

    off_t              size;
    ngx_chain_t       *cl, *ln, *chain;
    ngx_connection_t  *c;

    c = ctx->connection;

    for (size = 0; in; in = in->next) {

#if 1
        if (ngx_buf_size(in->buf) == 0 && !ngx_buf_special(in->buf)) {

            ngx_log_error(NGX_LOG_ALERT, ctx->pool->log, 0,
                          "zero size buf in chain writer "
                          "t:%d r:%d f:%d %p %p-%p %p %O-%O",
                          in->buf->temporary,
                          in->buf->recycled,
                          in->buf->in_file,
                          in->buf->start,
                          in->buf->pos,
                          in->buf->last,
                          in->buf->file,
                          in->buf->file_pos,
                          in->buf->file_last);

            ngx_debug_point();

            continue;
        }
#endif

        size += ngx_buf_size(in->buf);

        ngx_log_debug2(NGX_LOG_DEBUG_CORE, c->log, 0,
                       "chain writer buf fl:%d s:%uO",
                       in->buf->flush, ngx_buf_size(in->buf));

        cl = ngx_alloc_chain_link(ctx->pool);
        if (cl == NULL) {
            return NGX_ERROR;
        }

        cl->buf = in->buf;
        cl->next = NULL;
        *ctx->last = cl;
        ctx->last = &cl->next;
    }

    ngx_log_debug1(NGX_LOG_DEBUG_CORE, c->log, 0,
                   "chain writer in: %p", ctx->out);

    for (cl = ctx->out; cl; cl = cl->next) {

#if 1
        if (ngx_buf_size(cl->buf) == 0 && !ngx_buf_special(cl->buf)) {

            ngx_log_error(NGX_LOG_ALERT, ctx->pool->log, 0,
                          "zero size buf in chain writer "
                          "t:%d r:%d f:%d %p %p-%p %p %O-%O",
                          cl->buf->temporary,
                          cl->buf->recycled,
                          cl->buf->in_file,
                          cl->buf->start,
                          cl->buf->pos,
                          cl->buf->last,
                          cl->buf->file,
                          cl->buf->file_pos,
                          cl->buf->file_last);

            ngx_debug_point();

            continue;
        }
#endif

        size += ngx_buf_size(cl->buf);
    }

    if (size == 0 && !c->buffered) {
        return NGX_OK;
    }

    chain = c->send_chain(c, ctx->out, ctx->limit);

    ngx_log_debug1(NGX_LOG_DEBUG_CORE, c->log, 0,
                   "chain writer out: %p", chain);

    if (chain == NGX_CHAIN_ERROR) {
        return NGX_ERROR;
    }

    for (cl = ctx->out; cl && cl != chain; /* void */) {
        ln = cl;
        cl = cl->next;
        ngx_free_chain(ctx->pool, ln);
    }

    ctx->out = chain;

    if (ctx->out == NULL) {
        ctx->last = &ctx->out;

        if (!c->buffered) {
            return NGX_OK;
        }
    }

    return NGX_AGAIN;
}